

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_parse.cpp
# Opt level: O1

void argparse(Option_group *group)

{
  Option *pOVar1;
  string local_88;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"--dv","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  pOVar1 = CLI::App::add_option<Values<double>,_Values<double>,_(CLI::detail::enabler)0>
                     (&group->super_App,&local_68,&doubles,&local_88);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"0","");
  std::__cxx11::string::operator=((string *)&pOVar1->default_str_,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void argparse(CLI::Option_group *group) { group->add_option("--dv", doubles)->default_str("0"); }